

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256_x86_shani.cpp
# Opt level: O3

void sha256_x86_shani::Transform(uint32_t *s,uchar *chunk,size_t blocks)

{
  long lVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  long in_FS_OFFSET;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  auVar34._4_4_ = *s;
  auVar34._0_4_ = s[1];
  auVar34._8_4_ = s[3];
  auVar34._12_4_ = s[2];
  auVar45._4_4_ = s[6];
  auVar45._0_4_ = s[7];
  auVar45._8_4_ = s[5];
  auVar45._12_4_ = s[4];
  auVar2._16_16_ = auVar34;
  auVar2._0_16_ = auVar45;
  auVar47 = auVar2._8_16_;
  auVar46 = pblendw(auVar45,auVar34,0xf0);
  auVar34 = auVar46;
  auVar45 = auVar47;
  if (blocks != 0) {
    do {
      auVar41 = pshufb(*(undefined1 (*) [16])chunk,_DAT_001c2f30);
      auVar35._0_4_ = auVar41._0_4_ + 0x428a2f98;
      auVar35._4_4_ = auVar41._4_4_ + 0x71374491;
      auVar35._8_4_ = auVar41._8_4_ + -0x4a3f0431;
      auVar35._12_4_ = auVar41._12_4_ + -0x164a245b;
      auVar46 = sha256rnds2_sha(auVar34,auVar45,auVar35);
      auVar36._4_4_ = auVar35._12_4_;
      auVar36._0_4_ = auVar35._8_4_;
      auVar36._8_4_ = auVar35._0_4_;
      auVar36._12_4_ = auVar35._0_4_;
      auVar47 = sha256rnds2_sha(auVar45,auVar46,auVar36);
      auVar50 = pshufb(*(undefined1 (*) [16])((long)chunk + 0x10),_DAT_001c2f30);
      auVar38._0_4_ = auVar50._0_4_ + 0x3956c25b;
      auVar38._4_4_ = auVar50._4_4_ + 0x59f111f1;
      auVar38._8_4_ = auVar50._8_4_ + -0x6dc07d5c;
      auVar38._12_4_ = auVar50._12_4_ + -0x54e3a12b;
      auVar46 = sha256rnds2_sha(auVar46,auVar47,auVar38);
      auVar42._4_4_ = auVar38._12_4_;
      auVar42._0_4_ = auVar38._8_4_;
      auVar42._8_4_ = auVar38._0_4_;
      auVar42._12_4_ = auVar38._0_4_;
      auVar47 = sha256rnds2_sha(auVar47,auVar46,auVar42);
      auVar36 = pshufb(*(undefined1 (*) [16])((long)chunk + 0x20),_DAT_001c2f30);
      auVar51._0_4_ = auVar36._0_4_ + -0x27f85568;
      auVar51._4_4_ = auVar36._4_4_ + 0x12835b01;
      auVar51._8_4_ = auVar36._8_4_ + 0x243185be;
      auVar51._12_4_ = auVar36._12_4_ + 0x550c7dc3;
      auVar42 = sha256msg1_sha(auVar41,auVar50);
      auVar46 = sha256rnds2_sha(auVar46,auVar47,auVar51);
      auVar41._4_4_ = auVar51._12_4_;
      auVar41._0_4_ = auVar51._8_4_;
      auVar41._8_4_ = auVar51._0_4_;
      auVar41._12_4_ = auVar51._0_4_;
      auVar35 = sha256rnds2_sha(auVar47,auVar46,auVar41);
      auVar38 = pshufb(*(undefined1 (*) [16])((long)chunk + 0x30),_DAT_001c2f30);
      auVar51 = sha256msg1_sha(auVar50,auVar36);
      auVar50._0_4_ = auVar38._0_4_ + 0x72be5d74;
      auVar50._4_4_ = auVar38._4_4_ + -0x7f214e02;
      auVar50._8_4_ = auVar38._8_4_ + -0x6423f959;
      auVar50._12_4_ = auVar38._12_4_ + -0x3e640e8c;
      auVar20._4_4_ = auVar50._12_4_;
      auVar20._0_4_ = auVar50._8_4_;
      auVar20._8_4_ = auVar50._0_4_;
      auVar20._12_4_ = auVar50._0_4_;
      auVar47 = sha256rnds2_sha(auVar46,auVar35,auVar50);
      auVar35 = sha256rnds2_sha(auVar35,auVar47,auVar20);
      auVar31._0_4_ = auVar36._4_4_ + auVar42._0_4_;
      auVar31._4_4_ = auVar36._8_4_ + auVar42._4_4_;
      auVar31._8_4_ = auVar36._12_4_ + auVar42._8_4_;
      auVar31._12_4_ = auVar38._0_4_ + auVar42._12_4_;
      auVar46 = sha256msg2_sha(auVar31,auVar38);
      auVar36 = sha256msg1_sha(auVar36,auVar38);
      auVar4._0_4_ = auVar46._0_4_ + -0x1b64963f;
      auVar4._4_4_ = auVar46._4_4_ + -0x1041b87a;
      auVar4._8_4_ = auVar46._8_4_ + 0xfc19dc6;
      auVar4._12_4_ = auVar46._12_4_ + 0x240ca1cc;
      auVar21._4_4_ = auVar4._12_4_;
      auVar21._0_4_ = auVar4._8_4_;
      auVar21._8_4_ = auVar4._0_4_;
      auVar21._12_4_ = auVar4._0_4_;
      auVar47 = sha256rnds2_sha(auVar47,auVar35,auVar4);
      auVar35 = sha256rnds2_sha(auVar35,auVar47,auVar21);
      auVar48._0_4_ = auVar38._4_4_ + auVar51._0_4_;
      auVar48._4_4_ = auVar38._8_4_ + auVar51._4_4_;
      auVar48._8_4_ = auVar38._12_4_ + auVar51._8_4_;
      auVar48._12_4_ = auVar46._0_4_ + auVar51._12_4_;
      auVar42 = sha256msg2_sha(auVar48,auVar46);
      auVar38 = sha256msg1_sha(auVar38,auVar46);
      auVar5._0_4_ = auVar42._0_4_ + 0x2de92c6f;
      auVar5._4_4_ = auVar42._4_4_ + 0x4a7484aa;
      auVar5._8_4_ = auVar42._8_4_ + 0x5cb0a9dc;
      auVar5._12_4_ = auVar42._12_4_ + 0x76f988da;
      auVar22._4_4_ = auVar5._12_4_;
      auVar22._0_4_ = auVar5._8_4_;
      auVar22._8_4_ = auVar5._0_4_;
      auVar22._12_4_ = auVar5._0_4_;
      auVar47 = sha256rnds2_sha(auVar47,auVar35,auVar5);
      auVar35 = sha256rnds2_sha(auVar35,auVar47,auVar22);
      auVar43._0_4_ = auVar46._4_4_ + auVar36._0_4_;
      auVar43._4_4_ = auVar46._8_4_ + auVar36._4_4_;
      auVar43._8_4_ = auVar46._12_4_ + auVar36._8_4_;
      auVar43._12_4_ = auVar42._0_4_ + auVar36._12_4_;
      auVar36 = sha256msg2_sha(auVar43,auVar42);
      auVar46 = sha256msg1_sha(auVar46,auVar42);
      auVar6._0_4_ = auVar36._0_4_ + -0x67c1aeae;
      auVar6._4_4_ = auVar36._4_4_ + -0x57ce3993;
      auVar6._8_4_ = auVar36._8_4_ + -0x4ffcd838;
      auVar6._12_4_ = auVar36._12_4_ + -0x40a68039;
      auVar23._4_4_ = auVar6._12_4_;
      auVar23._0_4_ = auVar6._8_4_;
      auVar23._8_4_ = auVar6._0_4_;
      auVar23._12_4_ = auVar6._0_4_;
      auVar47 = sha256rnds2_sha(auVar47,auVar35,auVar6);
      auVar35 = sha256rnds2_sha(auVar35,auVar47,auVar23);
      auVar52._0_4_ = auVar42._4_4_ + auVar38._0_4_;
      auVar52._4_4_ = auVar42._8_4_ + auVar38._4_4_;
      auVar52._8_4_ = auVar42._12_4_ + auVar38._8_4_;
      auVar52._12_4_ = auVar36._0_4_ + auVar38._12_4_;
      auVar41 = sha256msg2_sha(auVar52,auVar36);
      auVar51 = sha256msg1_sha(auVar42,auVar36);
      auVar7._0_4_ = auVar41._0_4_ + -0x391ff40d;
      auVar7._4_4_ = auVar41._4_4_ + -0x2a586eb9;
      auVar7._8_4_ = auVar41._8_4_ + 0x6ca6351;
      auVar7._12_4_ = auVar41._12_4_ + 0x14292967;
      auVar24._4_4_ = auVar7._12_4_;
      auVar24._0_4_ = auVar7._8_4_;
      auVar24._8_4_ = auVar7._0_4_;
      auVar24._12_4_ = auVar7._0_4_;
      auVar47 = sha256rnds2_sha(auVar47,auVar35,auVar7);
      auVar35 = sha256rnds2_sha(auVar35,auVar47,auVar24);
      auVar39._0_4_ = auVar36._4_4_ + auVar46._0_4_;
      auVar39._4_4_ = auVar36._8_4_ + auVar46._4_4_;
      auVar39._8_4_ = auVar36._12_4_ + auVar46._8_4_;
      auVar39._12_4_ = auVar41._0_4_ + auVar46._12_4_;
      auVar38 = sha256msg2_sha(auVar39,auVar41);
      auVar8._0_4_ = auVar38._0_4_ + 0x27b70a85;
      auVar8._4_4_ = auVar38._4_4_ + 0x2e1b2138;
      auVar8._8_4_ = auVar38._8_4_ + 0x4d2c6dfc;
      auVar8._12_4_ = auVar38._12_4_ + 0x53380d13;
      auVar46 = sha256rnds2_sha(auVar47,auVar35,auVar8);
      auVar42 = sha256msg1_sha(auVar36,auVar41);
      auVar37._0_4_ = auVar41._4_4_ + auVar51._0_4_;
      auVar37._4_4_ = auVar41._8_4_ + auVar51._4_4_;
      auVar37._8_4_ = auVar41._12_4_ + auVar51._8_4_;
      auVar37._12_4_ = auVar38._0_4_ + auVar51._12_4_;
      auVar36 = sha256msg2_sha(auVar37,auVar38);
      auVar9._4_4_ = auVar8._12_4_;
      auVar9._0_4_ = auVar8._8_4_;
      auVar9._8_4_ = auVar8._0_4_;
      auVar9._12_4_ = auVar8._0_4_;
      auVar25._0_4_ = auVar36._0_4_ + 0x650a7354;
      auVar25._4_4_ = auVar36._4_4_ + 0x766a0abb;
      auVar25._8_4_ = auVar36._8_4_ + -0x7e3d36d2;
      auVar25._12_4_ = auVar36._12_4_ + -0x6d8dd37b;
      auVar47 = sha256rnds2_sha(auVar35,auVar46,auVar9);
      auVar46 = sha256rnds2_sha(auVar46,auVar47,auVar25);
      auVar35 = sha256msg1_sha(auVar41,auVar38);
      auVar49._0_4_ = auVar38._4_4_ + auVar42._0_4_;
      auVar49._4_4_ = auVar38._8_4_ + auVar42._4_4_;
      auVar49._8_4_ = auVar38._12_4_ + auVar42._8_4_;
      auVar49._12_4_ = auVar36._0_4_ + auVar42._12_4_;
      auVar51 = sha256msg2_sha(auVar49,auVar36);
      auVar10._4_4_ = auVar25._12_4_;
      auVar10._0_4_ = auVar25._8_4_;
      auVar10._8_4_ = auVar25._0_4_;
      auVar10._12_4_ = auVar25._0_4_;
      auVar38 = sha256msg1_sha(auVar38,auVar36);
      auVar44._0_4_ = auVar36._4_4_ + auVar35._0_4_;
      auVar44._4_4_ = auVar36._8_4_ + auVar35._4_4_;
      auVar44._8_4_ = auVar36._12_4_ + auVar35._8_4_;
      auVar44._12_4_ = auVar51._0_4_ + auVar35._12_4_;
      auVar26._0_4_ = auVar51._0_4_ + -0x5d40175f;
      auVar26._4_4_ = auVar51._4_4_ + -0x57e599b5;
      auVar26._8_4_ = auVar51._8_4_ + -0x3db47490;
      auVar26._12_4_ = auVar51._12_4_ + -0x3893ae5d;
      auVar47 = sha256rnds2_sha(auVar47,auVar46,auVar10);
      auVar42 = sha256msg2_sha(auVar44,auVar51);
      auVar35 = sha256msg1_sha(auVar36,auVar51);
      auVar46 = sha256rnds2_sha(auVar46,auVar47,auVar26);
      auVar53._0_4_ = auVar51._4_4_ + auVar38._0_4_;
      auVar53._4_4_ = auVar51._8_4_ + auVar38._4_4_;
      auVar53._8_4_ = auVar51._12_4_ + auVar38._8_4_;
      auVar53._12_4_ = auVar42._0_4_ + auVar38._12_4_;
      auVar11._4_4_ = auVar26._12_4_;
      auVar11._0_4_ = auVar26._8_4_;
      auVar11._8_4_ = auVar26._0_4_;
      auVar11._12_4_ = auVar26._0_4_;
      auVar27._0_4_ = auVar42._0_4_ + -0x2e6d17e7;
      auVar27._4_4_ = auVar42._4_4_ + -0x2966f9dc;
      auVar27._8_4_ = auVar42._8_4_ + -0xbf1ca7b;
      auVar27._12_4_ = auVar42._12_4_ + 0x106aa070;
      auVar47 = sha256rnds2_sha(auVar47,auVar46,auVar11);
      auVar32._4_4_ = auVar27._12_4_;
      auVar32._0_4_ = auVar27._8_4_;
      auVar32._8_4_ = auVar27._0_4_;
      auVar32._12_4_ = auVar27._0_4_;
      auVar41 = sha256msg2_sha(auVar53,auVar42);
      auVar46 = sha256rnds2_sha(auVar46,auVar47,auVar27);
      auVar51 = sha256msg1_sha(auVar51,auVar42);
      auVar47 = sha256rnds2_sha(auVar47,auVar46,auVar32);
      auVar40._0_4_ = auVar42._4_4_ + auVar35._0_4_;
      auVar40._4_4_ = auVar42._8_4_ + auVar35._4_4_;
      auVar40._8_4_ = auVar42._12_4_ + auVar35._8_4_;
      auVar40._12_4_ = auVar41._0_4_ + auVar35._12_4_;
      auVar38 = sha256msg2_sha(auVar40,auVar41);
      auVar42 = sha256msg1_sha(auVar42,auVar41);
      auVar12._0_4_ = auVar41._0_4_ + 0x19a4c116;
      auVar12._4_4_ = auVar41._4_4_ + 0x1e376c08;
      auVar12._8_4_ = auVar41._8_4_ + 0x2748774c;
      auVar12._12_4_ = auVar41._12_4_ + 0x34b0bcb5;
      auVar46 = sha256rnds2_sha(auVar46,auVar47,auVar12);
      auVar13._4_4_ = auVar12._12_4_;
      auVar13._0_4_ = auVar12._8_4_;
      auVar13._8_4_ = auVar12._0_4_;
      auVar13._12_4_ = auVar12._0_4_;
      auVar36 = sha256rnds2_sha(auVar47,auVar46,auVar13);
      auVar33._0_4_ = auVar41._4_4_ + auVar51._0_4_;
      auVar33._4_4_ = auVar41._8_4_ + auVar51._4_4_;
      auVar33._8_4_ = auVar41._12_4_ + auVar51._8_4_;
      auVar33._12_4_ = auVar38._0_4_ + auVar51._12_4_;
      auVar47 = sha256msg2_sha(auVar33,auVar38);
      auVar14._0_4_ = auVar38._0_4_ + 0x391c0cb3;
      auVar14._4_4_ = auVar38._4_4_ + 0x4ed8aa4a;
      auVar14._8_4_ = auVar38._8_4_ + 0x5b9cca4f;
      auVar14._12_4_ = auVar38._12_4_ + 0x682e6ff3;
      auVar35 = sha256rnds2_sha(auVar46,auVar36,auVar14);
      auVar15._4_4_ = auVar14._12_4_;
      auVar15._0_4_ = auVar14._8_4_;
      auVar15._8_4_ = auVar14._0_4_;
      auVar15._12_4_ = auVar14._0_4_;
      auVar36 = sha256rnds2_sha(auVar36,auVar35,auVar15);
      auVar28._0_4_ = auVar38._4_4_ + auVar42._0_4_;
      auVar28._4_4_ = auVar38._8_4_ + auVar42._4_4_;
      auVar28._8_4_ = auVar38._12_4_ + auVar42._8_4_;
      auVar28._12_4_ = auVar47._0_4_ + auVar42._12_4_;
      auVar46 = sha256msg2_sha(auVar28,auVar47);
      auVar16._0_4_ = auVar47._0_4_ + 0x748f82ee;
      auVar16._4_4_ = auVar47._4_4_ + 0x78a5636f;
      auVar16._8_4_ = auVar47._8_4_ + -0x7b3787ec;
      auVar16._12_4_ = auVar47._12_4_ + -0x7338fdf8;
      auVar47 = sha256rnds2_sha(auVar35,auVar36,auVar16);
      auVar17._4_4_ = auVar16._12_4_;
      auVar17._0_4_ = auVar16._8_4_;
      auVar17._8_4_ = auVar16._0_4_;
      auVar17._12_4_ = auVar16._0_4_;
      auVar36 = sha256rnds2_sha(auVar36,auVar47,auVar17);
      auVar29._0_4_ = auVar46._0_4_ + -0x6f410006;
      auVar29._4_4_ = auVar46._4_4_ + -0x5baf9315;
      auVar29._8_4_ = auVar46._8_4_ + -0x41065c09;
      auVar29._12_4_ = auVar46._12_4_ + -0x398e870e;
      auVar35 = sha256rnds2_sha(auVar47,auVar36,auVar29);
      auVar18._4_4_ = auVar29._12_4_;
      auVar18._0_4_ = auVar29._8_4_;
      auVar18._8_4_ = auVar29._0_4_;
      auVar18._12_4_ = auVar29._0_4_;
      auVar46 = sha256rnds2_sha(auVar36,auVar35,auVar18);
      auVar47._0_4_ = auVar45._0_4_ + auVar46._0_4_;
      auVar47._4_4_ = auVar45._4_4_ + auVar46._4_4_;
      auVar47._8_4_ = auVar45._8_4_ + auVar46._8_4_;
      auVar47._12_4_ = auVar45._12_4_ + auVar46._12_4_;
      auVar46._0_4_ = auVar34._0_4_ + auVar35._0_4_;
      auVar46._4_4_ = auVar34._4_4_ + auVar35._4_4_;
      auVar46._8_4_ = auVar34._8_4_ + auVar35._8_4_;
      auVar46._12_4_ = auVar34._12_4_ + auVar35._12_4_;
      chunk = (uchar *)((long)chunk + 0x40);
      blocks = blocks - 1;
      auVar34 = auVar46;
      auVar45 = auVar47;
    } while (blocks != 0);
  }
  auVar19._4_4_ = auVar47._8_4_;
  auVar19._0_4_ = auVar47._12_4_;
  auVar19._8_4_ = auVar47._4_4_;
  auVar19._12_4_ = auVar47._0_4_;
  auVar30._4_4_ = auVar46._0_4_;
  auVar30._0_4_ = auVar46._4_4_;
  auVar30._8_4_ = auVar46._12_4_;
  auVar30._12_4_ = auVar46._8_4_;
  auVar34 = pblendw(auVar19,auVar30,0xf0);
  auVar3._16_16_ = auVar30;
  auVar3._0_16_ = auVar19;
  *(undefined1 (*) [16])s = auVar34;
  *(undefined1 (*) [16])(s + 4) = auVar3._8_16_;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Transform(uint32_t* s, const unsigned char* chunk, size_t blocks)
{
    __m128i m0, m1, m2, m3, s0, s1, so0, so1;

    /* Load state */
    s0 = _mm_loadu_si128((const __m128i*)s);
    s1 = _mm_loadu_si128((const __m128i*)(s + 4));
    Shuffle(s0, s1);

    while (blocks--) {
        /* Remember old state */
        so0 = s0;
        so1 = s1;

        /* Load data and transform */
        m0 = Load(chunk);
        QuadRound(s0, s1, m0, 0xe9b5dba5b5c0fbcfull, 0x71374491428a2f98ull);
        m1 = Load(chunk + 16);
        QuadRound(s0, s1, m1, 0xab1c5ed5923f82a4ull, 0x59f111f13956c25bull);
        ShiftMessageA(m0, m1);
        m2 = Load(chunk + 32);
        QuadRound(s0, s1, m2, 0x550c7dc3243185beull, 0x12835b01d807aa98ull);
        ShiftMessageA(m1, m2);
        m3 = Load(chunk + 48);
        QuadRound(s0, s1, m3, 0xc19bf1749bdc06a7ull, 0x80deb1fe72be5d74ull);
        ShiftMessageB(m2, m3, m0);
        QuadRound(s0, s1, m0, 0x240ca1cc0fc19dc6ull, 0xefbe4786E49b69c1ull);
        ShiftMessageB(m3, m0, m1);
        QuadRound(s0, s1, m1, 0x76f988da5cb0a9dcull, 0x4a7484aa2de92c6full);
        ShiftMessageB(m0, m1, m2);
        QuadRound(s0, s1, m2, 0xbf597fc7b00327c8ull, 0xa831c66d983e5152ull);
        ShiftMessageB(m1, m2, m3);
        QuadRound(s0, s1, m3, 0x1429296706ca6351ull, 0xd5a79147c6e00bf3ull);
        ShiftMessageB(m2, m3, m0);
        QuadRound(s0, s1, m0, 0x53380d134d2c6dfcull, 0x2e1b213827b70a85ull);
        ShiftMessageB(m3, m0, m1);
        QuadRound(s0, s1, m1, 0x92722c8581c2c92eull, 0x766a0abb650a7354ull);
        ShiftMessageB(m0, m1, m2);
        QuadRound(s0, s1, m2, 0xc76c51A3c24b8b70ull, 0xa81a664ba2bfe8a1ull);
        ShiftMessageB(m1, m2, m3);
        QuadRound(s0, s1, m3, 0x106aa070f40e3585ull, 0xd6990624d192e819ull);
        ShiftMessageB(m2, m3, m0);
        QuadRound(s0, s1, m0, 0x34b0bcb52748774cull, 0x1e376c0819a4c116ull);
        ShiftMessageB(m3, m0, m1);
        QuadRound(s0, s1, m1, 0x682e6ff35b9cca4full, 0x4ed8aa4a391c0cb3ull);
        ShiftMessageC(m0, m1, m2);
        QuadRound(s0, s1, m2, 0x8cc7020884c87814ull, 0x78a5636f748f82eeull);
        ShiftMessageC(m1, m2, m3);
        QuadRound(s0, s1, m3, 0xc67178f2bef9A3f7ull, 0xa4506ceb90befffaull);

        /* Combine with old state */
        s0 = _mm_add_epi32(s0, so0);
        s1 = _mm_add_epi32(s1, so1);

        /* Advance */
        chunk += 64;
    }

    Unshuffle(s0, s1);
    _mm_storeu_si128((__m128i*)s, s0);
    _mm_storeu_si128((__m128i*)(s + 4), s1);
}